

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torcontrol.cpp
# Opt level: O3

void __thiscall
TorController::TorController
          (TorController *this,event_base *_base,string *tor_control_center,CService *target)

{
  string *tor_control_center_00;
  long lVar1;
  pointer pcVar2;
  uint32_t uVar3;
  bool bVar4;
  event *peVar5;
  Logger *this_00;
  char *this_01;
  TorController *this_02;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  _Any_data local_88;
  code *local_78;
  code *local_70;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> pkf;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this->base = _base;
  tor_control_center_00 = &this->m_tor_control_center;
  (this->m_tor_control_center)._M_dataplus._M_p = (pointer)&(this->m_tor_control_center).field_2;
  pcVar2 = (tor_control_center->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)tor_control_center_00,pcVar2,pcVar2 + tor_control_center->_M_string_length);
  TorControlConnection::TorControlConnection(&this->conn,this->base);
  (this->private_key)._M_dataplus._M_p = (pointer)&(this->private_key).field_2;
  (this->private_key)._M_string_length = 0;
  (this->private_key).field_2._M_local_buf[0] = '\0';
  (this->service_id)._M_dataplus._M_p = (pointer)&(this->service_id).field_2;
  (this->service_id)._M_string_length = 0;
  (this->service_id).field_2._M_local_buf[0] = '\0';
  this->reconnect = true;
  this->reconnect_ev = (event *)0x0;
  this->reconnect_timeout = 1.0;
  CService::CService(&this->service);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&this->m_target,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)target);
  uVar3 = (target->super_CNetAddr).m_scope_id;
  (this->m_target).super_CNetAddr.m_net = (target->super_CNetAddr).m_net;
  (this->m_target).super_CNetAddr.m_scope_id = uVar3;
  (this->m_target).port = target->port;
  (this->cookie).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cookie).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cookie).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->clientNonce).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->clientNonce).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->clientNonce).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  peVar5 = (event *)event_new(this->base,0xffffffff,0,reconnect_cb,this);
  this->reconnect_ev = peVar5;
  if (peVar5 == (event *)0x0) {
    logging_function._M_str = "TorController";
    logging_function._M_len = 0xd;
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/torcontrol.cpp";
    source_file._M_len = 0x57;
    ::LogPrintf_<>(logging_function,source_file,0x148,ALL,Info,
                   "tor: Failed to create event for reconnection: out of memory?\n");
  }
  pkf.second._M_dataplus._M_p = (pointer)0x0;
  pkf._0_8_ = operator_new(0x18);
  *(code **)pkf._0_8_ = connected_cb;
  *(undefined8 *)(pkf._0_8_ + 8) = 0;
  *(TorController **)(pkf._0_8_ + 0x10) = this;
  pkf.second.field_2._M_allocated_capacity =
       (size_type)
       std::
       _Function_handler<void_(TorControlConnection_&),_std::_Bind<void_(TorController::*(TorController_*,_std::_Placeholder<1>))(TorControlConnection_&)>_>
       ::_M_invoke;
  pkf.second._M_string_length =
       (size_type)
       std::
       _Function_handler<void_(TorControlConnection_&),_std::_Bind<void_(TorController::*(TorController_*,_std::_Placeholder<1>))(TorControlConnection_&)>_>
       ::_M_manager;
  local_88._8_8_ = 0;
  local_88._M_unused._M_object = operator_new(0x18);
  *(code **)local_88._M_unused._0_8_ = disconnected_cb;
  *(undefined8 *)((long)local_88._M_unused._0_8_ + 8) = 0;
  *(TorController **)((long)local_88._M_unused._0_8_ + 0x10) = this;
  local_70 = std::
             _Function_handler<void_(TorControlConnection_&),_std::_Bind<void_(TorController::*(TorController_*,_std::_Placeholder<1>))(TorControlConnection_&)>_>
             ::_M_invoke;
  local_78 = std::
             _Function_handler<void_(TorControlConnection_&),_std::_Bind<void_(TorController::*(TorController_*,_std::_Placeholder<1>))(TorControlConnection_&)>_>
             ::_M_manager;
  this_01 = (char *)tor_control_center_00;
  bVar4 = TorControlConnection::Connect
                    (&this->conn,tor_control_center_00,(ConnectionCB *)&pkf,
                     (ConnectionCB *)&local_88);
  if (local_78 != (code *)0x0) {
    this_01 = (char *)&local_88;
    (*local_78)(this_01,this_01,3);
  }
  if (pkf.second._M_string_length != 0) {
    this_01 = &pkf.first;
    (*(code *)pkf.second._M_string_length)(this_01,this_01,3);
  }
  if (!bVar4) {
    logging_function_00._M_str = "TorController";
    logging_function_00._M_len = 0xd;
    this_01 = "TorController";
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/torcontrol.cpp";
    source_file_00._M_len = 0x57;
    ::LogPrintf_<std::__cxx11::string>
              (logging_function_00,source_file_00,0x14c,ALL,Info,
               "tor: Initiating connection to Tor control port %s failed\n",tor_control_center_00);
  }
  GetPrivateKeyFile((path *)&local_88,(TorController *)this_01);
  ReadBinaryFile_abi_cxx11_(&pkf,(path *)&local_88,0xffffffffffffffff);
  std::filesystem::__cxx11::path::~path((path *)&local_88);
  if (pkf.first == true) {
    this_00 = LogInstance();
    this_02 = (TorController *)0x2;
    bVar4 = BCLog::Logger::WillLogCategoryLevel(this_00,TOR,Debug);
    if (bVar4) {
      GetPrivateKeyFile((path *)&local_88,this_02);
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a8,local_88._M_unused._M_object,
                 local_88._8_8_ + (long)local_88._M_unused._0_8_);
      logging_function_01._M_str = "TorController";
      logging_function_01._M_len = 0xd;
      source_file_01._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/torcontrol.cpp"
      ;
      source_file_01._M_len = 0x57;
      ::LogPrintf_<std::__cxx11::string>
                (logging_function_01,source_file_01,0x151,TOR,Debug,
                 "Reading cached private key from %s\n",&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      std::filesystem::__cxx11::path::~path((path *)&local_88);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&this->private_key,&pkf.second);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pkf.second._M_dataplus._M_p != &pkf.second.field_2) {
    operator_delete(pkf.second._M_dataplus._M_p,pkf.second.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

TorController::TorController(struct event_base* _base, const std::string& tor_control_center, const CService& target):
    base(_base),
    m_tor_control_center(tor_control_center), conn(base), reconnect(true), reconnect_timeout(RECONNECT_TIMEOUT_START),
    m_target(target)
{
    reconnect_ev = event_new(base, -1, 0, reconnect_cb, this);
    if (!reconnect_ev)
        LogPrintf("tor: Failed to create event for reconnection: out of memory?\n");
    // Start connection attempts immediately
    if (!conn.Connect(m_tor_control_center, std::bind(&TorController::connected_cb, this, std::placeholders::_1),
         std::bind(&TorController::disconnected_cb, this, std::placeholders::_1) )) {
        LogPrintf("tor: Initiating connection to Tor control port %s failed\n", m_tor_control_center);
    }
    // Read service private key if cached
    std::pair<bool,std::string> pkf = ReadBinaryFile(GetPrivateKeyFile());
    if (pkf.first) {
        LogDebug(BCLog::TOR, "Reading cached private key from %s\n", fs::PathToString(GetPrivateKeyFile()));
        private_key = pkf.second;
    }
}